

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void __thiscall Router::Router(Router *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference b;
  reference pvVar6;
  value_type local_180;
  Vec2 local_a0;
  Vec2 local_98;
  value_type local_90;
  value_type local_88;
  value_type local_80;
  int local_78;
  int local_74;
  int v;
  int u;
  int iStack_68;
  bool flag;
  int j;
  int i_2;
  int i_1;
  Vec2 local_58;
  Vec2 t3;
  Vec2 local_48;
  Vec2 t2;
  Vec2 local_38;
  Vec2 t1;
  Vec2 local_28;
  Vec2 t0;
  int i;
  Router *this_local;
  
  std::
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ::vector(&this->Obstacles);
  std::vector<Vec2,_std::allocator<Vec2>_>::vector(&this->Vertexes);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->Edges);
  this->ObstacleCount = 0xb;
  std::
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ::resize(&this->Obstacles,(long)this->ObstacleCount);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,0);
  setObstacle(pvVar2,0.0,0.0,21.0,7.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,1);
  setObstacle(pvVar2,15.0,9.0,25.5,17.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,2);
  setObstacle(pvVar2,0.0,11.0,15.0,22.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,3);
  setObstacle(pvVar2,0.0,22.0,25.5,29.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,4);
  setObstacle(pvVar2,31.0,7.0,42.0,28.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,5);
  setObstacle(pvVar2,42.0,0.0,60.0,52.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,6);
  setObstacle(pvVar2,22.0,31.0,39.0,48.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,7);
  setObstacle(pvVar2,0.0,44.0,10.0,54.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,8);
  setObstacle(pvVar2,0.0,54.0,23.0,90.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,9);
  setObstacle(pvVar2,27.0,86.0,60.0,90.0);
  pvVar2 = std::
           vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
           ::operator[](&this->Obstacles,10);
  setObstacle(pvVar2,37.0,68.0,51.0,82.0);
  for (t0.x = 0.0; (int)t0.x < this->ObstacleCount; t0.x = (float)((int)t0.x + 1)) {
    pvVar2 = std::
             vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ::operator[](&this->Obstacles,(long)(int)t0.x);
    pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar2,0);
    Vec2::Vec2(&t1,-0.05,-0.05);
    local_28 = Vec2::operator+(pvVar3,&t1);
    pvVar2 = std::
             vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ::operator[](&this->Obstacles,(long)(int)t0.x);
    pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar2,1);
    Vec2::Vec2(&t2,-0.05,0.05);
    local_38 = Vec2::operator+(pvVar3,&t2);
    pvVar2 = std::
             vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ::operator[](&this->Obstacles,(long)(int)t0.x);
    pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar2,2);
    Vec2::Vec2(&t3,0.05,0.05);
    local_48 = Vec2::operator+(pvVar3,&t3);
    pvVar2 = std::
             vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ::operator[](&this->Obstacles,(long)(int)t0.x);
    pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar2,3);
    Vec2::Vec2((Vec2 *)&i_2,0.05,-0.05);
    local_58 = Vec2::operator+(pvVar3,(Vec2 *)&i_2);
    if ((((0.0 <= local_28.x) && (local_28.x <= 60.0)) && (0.0 <= local_28.y)) &&
       (local_28.y <= 90.0)) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(&this->Vertexes,&local_28);
    }
    if (((0.0 <= local_38.x) && (local_38.x <= 60.0)) &&
       ((0.0 <= local_38.y && (local_38.y <= 90.0)))) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(&this->Vertexes,&local_38);
    }
    if (((0.0 <= local_48.x) && (local_48.x <= 60.0)) &&
       ((0.0 <= local_48.y && (local_48.y <= 90.0)))) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(&this->Vertexes,&local_48);
    }
    if ((((0.0 <= local_58.x) && (local_58.x <= 60.0)) && (0.0 <= local_58.y)) &&
       (local_58.y <= 90.0)) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(&this->Vertexes,&local_58);
    }
  }
  sVar4 = std::vector<Vec2,_std::allocator<Vec2>_>::size(&this->Vertexes);
  this->VertexCount = (int)sVar4;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->Edges,(long)this->VertexCount);
  for (j = 0; j < this->VertexCount; j = j + 1) {
    pvVar5 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&this->Edges,(long)j);
    std::vector<float,_std::allocator<float>_>::resize(pvVar5,(long)this->VertexCount);
  }
  iStack_68 = 0;
  do {
    u = iStack_68;
    if (this->VertexCount <= iStack_68) {
      return;
    }
    while (u = u + 1, u < this->VertexCount) {
      v._3_1_ = 1;
      for (local_74 = 0; local_74 < this->ObstacleCount; local_74 = local_74 + 1) {
        for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
          pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                             (&this->Vertexes,(long)iStack_68);
          local_80 = *pvVar3;
          pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](&this->Vertexes,(long)u);
          local_88 = *pvVar3;
          pvVar2 = std::
                   vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                   ::operator[](&this->Obstacles,(long)local_74);
          pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar2,(long)local_78);
          local_90 = *pvVar3;
          pvVar2 = std::
                   vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                   ::operator[](&this->Obstacles,(long)local_74);
          pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                             (pvVar2,(ulong)(local_78 + 1U & 3));
          local_98.x = pvVar3->x;
          local_98.y = pvVar3->y;
          bVar1 = intersect(local_80,local_88,local_90,local_98);
          if (bVar1) {
            v._3_1_ = 0;
            break;
          }
        }
        if ((v._3_1_ & 1) == 0) break;
      }
      if ((v._3_1_ & 1) == 0) {
        local_180 = 1e+08;
      }
      else {
        pvVar3 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                           (&this->Vertexes,(long)iStack_68);
        b = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](&this->Vertexes,(long)u);
        local_a0 = Vec2::operator-(pvVar3,b);
        local_180 = Vec2::length(&local_a0);
      }
      pvVar5 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&this->Edges,(long)u);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,(long)iStack_68);
      *pvVar6 = local_180;
      pvVar5 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&this->Edges,(long)iStack_68);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,(long)u);
      *pvVar6 = local_180;
    }
    iStack_68 = iStack_68 + 1;
  } while( true );
}

Assistant:

Router::Router()
{
    ObstacleCount = 11;
    Obstacles.resize(ObstacleCount);

    setObstacle(Obstacles[0],  0,  0, 21,  7);
    setObstacle(Obstacles[1], 15,  9, 25.5, 17);
    setObstacle(Obstacles[2],  0, 11, 15, 22);
    setObstacle(Obstacles[3],  0, 22, 25.5, 29);
    setObstacle(Obstacles[4], 31,  7, 42, 28);
    setObstacle(Obstacles[5], 42,  0, 60, 52);
    setObstacle(Obstacles[6], 22, 31, 39, 48);
    setObstacle(Obstacles[7],  0, 44, 10, 54);
    setObstacle(Obstacles[8],  0, 54, 23, 90);
    setObstacle(Obstacles[9], 27, 86, 60, 90);
    setObstacle(Obstacles[10],37, 68, 51, 82);

    for (int i = 0; i < ObstacleCount; ++i)
    {
        Vec2 t0 = Obstacles[i][0] + Vec2(-ObsBorder, -ObsBorder);
        Vec2 t1 = Obstacles[i][1] + Vec2(-ObsBorder, ObsBorder);
        Vec2 t2 = Obstacles[i][2] + Vec2(ObsBorder, ObsBorder);
        Vec2 t3 = Obstacles[i][3] + Vec2(ObsBorder, -ObsBorder);
#define CHECK(t) if (t.x >= 0 && t.x <= MapWidth && t.y >= 0 && t.y <= MapHeight) Vertexes.push_back(t);
        CHECK(t0)
        CHECK(t1)
        CHECK(t2)
        CHECK(t3)
#undef CHECK
    }
    VertexCount = Vertexes.size();
    Edges.resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        Edges[i].resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        for (int j = i + 1; j < VertexCount; ++j)
        {
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(Vertexes[i], Vertexes[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
                        flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            Edges[i][j] = Edges[j][i] = (flag ? (Vertexes[i] - Vertexes[j]).length() : FINF);
        }
}